

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O0

xmlIntFunc * xmlUnicodeLookup(xmlUnicodeNameTable *tptr,char *tname)

{
  xmlUnicodeRange *pxVar1;
  int iVar2;
  int iVar3;
  xmlUnicodeRange *sptr;
  int cmp;
  int mid;
  int high;
  int low;
  char *tname_local;
  xmlUnicodeNameTable *tptr_local;
  
  if ((tptr != (xmlUnicodeNameTable *)0x0) && (tname != (char *)0x0)) {
    mid = 0;
    cmp = tptr->numentries + -1;
    pxVar1 = tptr->table;
    while (mid <= cmp) {
      iVar2 = (mid + cmp) / 2;
      iVar3 = strcmp(tname,pxVar1[iVar2].rangename);
      if (iVar3 == 0) {
        return pxVar1[iVar2].func;
      }
      if (iVar3 < 0) {
        cmp = iVar2 + -1;
      }
      else {
        mid = iVar2 + 1;
      }
    }
  }
  return (xmlIntFunc *)0x0;
}

Assistant:

static xmlIntFunc
*xmlUnicodeLookup(const xmlUnicodeNameTable *tptr, const char *tname) {
    int low, high, mid, cmp;
    const xmlUnicodeRange *sptr;

    if ((tptr == NULL) || (tname == NULL)) return(NULL);

    low = 0;
    high = tptr->numentries - 1;
    sptr = tptr->table;
    while (low <= high) {
	mid = (low + high) / 2;
	if ((cmp=strcmp(tname, sptr[mid].rangename)) == 0)
	    return (sptr[mid].func);
	if (cmp < 0)
	    high = mid - 1;
	else
	    low = mid + 1;
    }
    return (NULL);
}